

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

int mu_textbox_raw(mu_Context *ctx,char *buf,int bufsz,mu_Id id,mu_Rect r,int opt)

{
  mu_Vec2 pos;
  mu_Color color;
  mu_Font font;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  mu_Rect rect;
  
  mu_update_control(ctx,id,r,opt | 0x100);
  uVar5 = 0;
  if (ctx->focus == id) {
    sVar3 = strlen(buf);
    uVar4 = (uint)sVar3;
    sVar3 = strlen(ctx->input_text);
    uVar5 = ~uVar4 + bufsz;
    if ((int)(uint)sVar3 <= (int)(~uVar4 + bufsz)) {
      uVar5 = (uint)sVar3;
    }
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    else {
      memcpy(buf + (int)uVar4,ctx->input_text,(ulong)uVar5);
      uVar4 = uVar4 + uVar5;
      buf[(int)uVar4] = '\0';
      uVar5 = 4;
    }
    uVar1 = ctx->key_pressed;
    if (0 < (int)uVar4 && (uVar1 & 8) != 0) {
      uVar5 = 4;
      buf[uVar4 - 1] = '\0';
      uVar1 = ctx->key_pressed;
    }
    if ((uVar1 & 0x10) != 0) {
      ctx->focus = 0;
      ctx->updated_focus = 1;
      uVar5 = uVar5 | 2;
    }
  }
  mu_draw_control_frame(ctx,id,r,9,opt);
  if (ctx->focus == id) {
    color = ctx->style->colors[0];
    font = ctx->style->font;
    iVar2 = (*ctx->text_width)(font,buf,-1,ctx->user_data);
    uVar4 = (*ctx->text_height)(font);
    iVar6 = ctx->style->padding;
    iVar7 = ~(iVar6 + iVar2) + r.w;
    if (iVar6 <= iVar7) {
      iVar7 = iVar6;
    }
    iVar7 = iVar7 + r.x;
    iVar6 = r.y + (int)(r.h - uVar4) / 2;
    mu_push_clip_rect(ctx,r);
    pos.y = iVar6;
    pos.x = iVar7;
    mu_draw_text(ctx,font,buf,-1,pos,color);
    rect.y = iVar6;
    rect.x = iVar7 + iVar2;
    rect._8_8_ = ((ulong)uVar4 << 0x20) + 1;
    mu_draw_rect(ctx,rect,color);
    mu_pop_clip_rect(ctx);
  }
  else {
    mu_draw_control_text(ctx,buf,r,0,opt);
  }
  return uVar5;
}

Assistant:

int mu_textbox_raw(mu_Context *ctx, char *buf, int bufsz, mu_Id id, mu_Rect r,
  int opt)
{
  int res = 0;
  mu_update_control(ctx, id, r, opt | MU_OPT_HOLDFOCUS);

  if (ctx->focus == id) {
    /* handle text input */
    int len = strlen(buf);
    int n = mu_min(bufsz - len - 1, (int) strlen(ctx->input_text));
    if (n > 0) {
      memcpy(buf + len, ctx->input_text, n);
      len += n;
      buf[len] = '\0';
      res |= MU_RES_CHANGE;
    }
    /* handle backspace */
    if (ctx->key_pressed & MU_KEY_BACKSPACE && len > 0) {
      /* skip utf-8 continuation bytes */
      while ((buf[--len] & 0xc0) == 0x80 && len > 0);
      buf[len] = '\0';
      res |= MU_RES_CHANGE;
    }
    /* handle return */
    if (ctx->key_pressed & MU_KEY_RETURN) {
      mu_set_focus(ctx, 0);
      res |= MU_RES_SUBMIT;
    }
  }

  /* draw */
  mu_draw_control_frame(ctx, id, r, MU_COLOR_BASE, opt);
  if (ctx->focus == id) {
    mu_Color color = ctx->style->colors[MU_COLOR_TEXT];
    mu_Font font = ctx->style->font;
    int textw = ctx->text_width(font, buf, -1, ctx->user_data);
    int texth = ctx->text_height(font);
    int ofx = r.w - ctx->style->padding - textw - 1;
    int textx = r.x + mu_min(ofx, ctx->style->padding);
    int texty = r.y + (r.h - texth) / 2;
    mu_push_clip_rect(ctx, r);
    mu_draw_text(ctx, font, buf, -1, mu_vec2(textx, texty), color);
    mu_draw_rect(ctx, mu_rect(textx + textw, texty, 1, texth), color);
    mu_pop_clip_rect(ctx);
  } else {
    mu_draw_control_text(ctx, buf, r, MU_COLOR_TEXT, opt);
  }

  return res;
}